

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString *
icu_63::UnicodeString::fromUTF32
          (UnicodeString *__return_storage_ptr__,UChar32 *utf32,int32_t length)

{
  UBool UVar1;
  int32_t destCapacity;
  char16_t *dest;
  UErrorCode local_44;
  int32_t local_40;
  UErrorCode errorCode;
  int32_t length16;
  char16_t *local_30;
  UChar *utf16;
  undefined1 local_1d;
  int32_t capacity;
  UChar32 *pUStack_18;
  int32_t length_local;
  UChar32 *utf32_local;
  UnicodeString *result;
  
  local_1d = 0;
  capacity = length;
  pUStack_18 = utf32;
  utf32_local = (UChar32 *)__return_storage_ptr__;
  UnicodeString(__return_storage_ptr__);
  if (capacity < 0x1c) {
    utf16._4_4_ = 0x1b;
  }
  else {
    utf16._4_4_ = capacity + (capacity >> 4) + 4;
  }
  while( true ) {
    dest = getBuffer(__return_storage_ptr__,utf16._4_4_);
    local_44 = U_ZERO_ERROR;
    local_30 = dest;
    destCapacity = getCapacity(__return_storage_ptr__);
    u_strFromUTF32WithSub_63
              (dest,destCapacity,&local_40,pUStack_18,capacity,0xfffd,(int32_t *)0x0,&local_44);
    releaseBuffer(__return_storage_ptr__,local_40);
    if (local_44 != U_BUFFER_OVERFLOW_ERROR) break;
    utf16._4_4_ = local_40 + 1;
  }
  UVar1 = ::U_FAILURE(local_44);
  if (UVar1 != '\0') {
    setToBogus(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString UnicodeString::fromUTF32(const UChar32 *utf32, int32_t length) {
  UnicodeString result;
  int32_t capacity;
  // Most UTF-32 strings will be BMP-only and result in a same-length
  // UTF-16 string. We overestimate the capacity just slightly,
  // just in case there are a few supplementary characters.
  if(length <= US_STACKBUF_SIZE) {
    capacity = US_STACKBUF_SIZE;
  } else {
    capacity = length + (length >> 4) + 4;
  }
  do {
    UChar *utf16 = result.getBuffer(capacity);
    int32_t length16;
    UErrorCode errorCode = U_ZERO_ERROR;
    u_strFromUTF32WithSub(utf16, result.getCapacity(), &length16,
        utf32, length,
        0xfffd,  // Substitution character.
        NULL,    // Don't care about number of substitutions.
        &errorCode);
    result.releaseBuffer(length16);
    if(errorCode == U_BUFFER_OVERFLOW_ERROR) {
      capacity = length16 + 1;  // +1 for the terminating NUL.
      continue;
    } else if(U_FAILURE(errorCode)) {
      result.setToBogus();
    }
    break;
  } while(TRUE);
  return result;
}